

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_clear_bindings(sqlite3_stmt *pStmt)

{
  sqlite3_mutex *psVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  psVar1 = *(sqlite3_mutex **)(*(long *)pStmt + 0x18);
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar1);
  }
  if (0 < *(short *)(pStmt + 0x20)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      lVar2 = *(long *)(pStmt + 0x80);
      if (((*(byte *)(lVar2 + 0x15 + lVar4) & 0x90) != 0) || (*(int *)(lVar2 + 0x20 + lVar4) != 0))
      {
        vdbeMemClear((Mem *)(lVar2 + lVar4));
      }
      *(undefined2 *)(*(long *)(pStmt + 0x80) + 0x14 + lVar4) = 1;
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar3 < *(short *)(pStmt + 0x20));
  }
  if (*(int *)(pStmt + 0x11c) != 0) {
    pStmt[0xc6] = (sqlite3_stmt)(((byte)pStmt[0xc6] & 0xfc) + 1);
  }
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar1);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_clear_bindings(sqlite3_stmt *pStmt){
  int i;
  int rc = SQLITE_OK;
  Vdbe *p = (Vdbe*)pStmt;
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex = ((Vdbe*)pStmt)->db->mutex;
#endif
  sqlite3_mutex_enter(mutex);
  for(i=0; i<p->nVar; i++){
    sqlite3VdbeMemRelease(&p->aVar[i]);
    p->aVar[i].flags = MEM_Null;
  }
  assert( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || p->expmask==0 );
  if( p->expmask ){
    p->expired = 1;
  }
  sqlite3_mutex_leave(mutex);
  return rc;
}